

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandCubes(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  uint fXor;
  char *pcVar3;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fXor = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"xh"), iVar1 == 0x78) {
    fXor = fXor ^ 1;
  }
  if (iVar1 == -1) {
    if (pAVar2 == (Abc_Ntk_t *)0x0) {
      pcVar3 = "Empty network.\n";
    }
    else if ((pAVar2->ntkFunc == ABC_FUNC_SOP) && (pAVar2->ntkType == ABC_NTK_LOGIC)) {
      pAVar2 = Abc_NtkSopToCubes(pAVar2,fXor);
      if (pAVar2 != (Abc_Ntk_t *)0x0) {
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      pcVar3 = "Converting to cubes has failed.\n";
    }
    else {
      pcVar3 = "Only a SOP logic network can be transformed into cubes.\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: cubes [-xh]\n");
    Abc_Print(-2,"\t        converts the current network into a network derived by creating\n");
    Abc_Print(-2,"\t        a separate node for each product and sum in the local SOPs\n");
    pcVar3 = "yes";
    if (fXor == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-x    : toggle using XOR instead of OR [default = %s]\n",pcVar3);
    pcVar3 = "\t-h    : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandCubes( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkSopToCubes( Abc_Ntk_t * pNtk, int fXor );
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, fXor = 0;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "xh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'x':
            fXor ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Only a SOP logic network can be transformed into cubes.\n" );
        return 1;
    }

    // get the new network
    pNtkRes = Abc_NtkSopToCubes( pNtk, fXor );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Converting to cubes has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: cubes [-xh]\n" );
    Abc_Print( -2, "\t        converts the current network into a network derived by creating\n" );
    Abc_Print( -2, "\t        a separate node for each product and sum in the local SOPs\n" );
    Abc_Print( -2, "\t-x    : toggle using XOR instead of OR [default = %s]\n", fXor? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}